

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  byte bVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  bool bVar6;
  int nameOk;
  xmlChar tmp_1;
  xmlChar *name;
  xmlChar *tmp;
  xmlParserInputPtr input;
  xmlChar *cur;
  xmlChar *ret;
  int iStack_38;
  xmlChar stop;
  int maxLength;
  int l;
  int c;
  int size;
  int len;
  xmlChar *buf;
  xmlChar **orig_local;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlParserInputPtr)0x0;
  c = 0;
  l = 100;
  ret._4_4_ = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    ret._4_4_ = 1000000000;
  }
  cur = (xmlChar *)0x0;
  input = (xmlParserInputPtr)0x0;
  buf = (xmlChar *)orig;
  orig_local = (xmlChar **)ctxt;
  if (*ctxt->input->cur == '\"') {
    ret._3_1_ = 0x22;
  }
  else {
    if (*ctxt->input->cur != '\'') {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    ret._3_1_ = 0x27;
  }
  _size = (xmlParserInputPtr)(*xmlMallocAtomic)(100);
  if (_size == (xmlParserInputPtr)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)orig_local,(char *)0x0);
    return (xmlChar *)0x0;
  }
  *(undefined4 *)(orig_local + 0x22) = 0xb;
  pxVar5 = orig_local[7];
  if ((*(int *)((long)orig_local + 0x1c4) == 0) &&
     (*(long *)(orig_local[7] + 0x28) - *(long *)(orig_local[7] + 0x20) < 0xfa)) {
    xmlGROW((xmlParserCtxtPtr)orig_local);
  }
  if (*(int *)(orig_local + 0x22) != -1) {
    xmlNextChar((xmlParserCtxtPtr)orig_local);
    maxLength = xmlCurrentChar((xmlParserCtxtPtr)orig_local,&stack0xffffffffffffffc8);
    do {
      if (maxLength < 0x100) {
        if (((8 < maxLength) && (maxLength < 0xb)) ||
           ((maxLength == 0xd || (bVar6 = false, 0x1f < maxLength)))) {
LAB_00171774:
          if ((maxLength != (uint)ret._3_1_) || (bVar6 = false, orig_local[7] != pxVar5)) {
            bVar6 = *(int *)(orig_local + 0x22) != -1;
          }
        }
      }
      else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
               ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
              ((bVar6 = false, 0xffff < maxLength && (bVar6 = false, maxLength < 0x110000))))
      goto LAB_00171774;
      if (!bVar6) {
        *(undefined1 *)((long)&_size->buf + (long)c) = 0;
        if (*(int *)(orig_local + 0x22) == -1) goto LAB_00171b19;
        if (maxLength == (uint)ret._3_1_) {
          xmlNextChar((xmlParserCtxtPtr)orig_local);
          input = _size;
          goto LAB_001719a8;
        }
        xmlFatalErr((xmlParserCtxtPtr)orig_local,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
        goto LAB_00171b19;
      }
      pxVar4 = _size;
      if (l <= c + 5) {
        l = l << 1;
        pxVar4 = (xmlParserInputPtr)(*xmlRealloc)(_size,(long)l);
        if (pxVar4 == (xmlParserInputPtr)0x0) {
          xmlErrMemory((xmlParserCtxtPtr)orig_local,(char *)0x0);
          goto LAB_00171b19;
        }
      }
      _size = pxVar4;
      if (iStack_38 == 1) {
        *(char *)((long)&_size->buf + (long)c) = (char)maxLength;
        c = c + 1;
      }
      else {
        iVar3 = xmlCopyCharMultiByte((xmlChar *)((long)&_size->buf + (long)c),maxLength);
        c = iVar3 + c;
      }
      if (**(char **)(orig_local[7] + 0x20) == '\n') {
        *(int *)(orig_local[7] + 0x34) = *(int *)(orig_local[7] + 0x34) + 1;
        pxVar2 = orig_local[7];
        pxVar2[0x38] = '\x01';
        pxVar2[0x39] = '\0';
        pxVar2[0x3a] = '\0';
        pxVar2[0x3b] = '\0';
      }
      else {
        *(int *)(orig_local[7] + 0x38) = *(int *)(orig_local[7] + 0x38) + 1;
      }
      *(long *)(orig_local[7] + 0x20) = *(long *)(orig_local[7] + 0x20) + (long)iStack_38;
      if ((*(int *)((long)orig_local + 0x1c4) == 0) &&
         (*(long *)(orig_local[7] + 0x28) - *(long *)(orig_local[7] + 0x20) < 0xfa)) {
        xmlGROW((xmlParserCtxtPtr)orig_local);
      }
      maxLength = xmlCurrentChar((xmlParserCtxtPtr)orig_local,&stack0xffffffffffffffc8);
      if (maxLength == 0) {
        if ((*(int *)((long)orig_local + 0x1c4) == 0) &&
           (*(long *)(orig_local[7] + 0x28) - *(long *)(orig_local[7] + 0x20) < 0xfa)) {
          xmlGROW((xmlParserCtxtPtr)orig_local);
        }
        maxLength = xmlCurrentChar((xmlParserCtxtPtr)orig_local,&stack0xffffffffffffffc8);
      }
    } while (c <= ret._4_4_);
    xmlFatalErrMsg((xmlParserCtxtPtr)orig_local,XML_ERR_ENTITY_NOT_FINISHED,
                   "entity value too long\n");
  }
LAB_00171b19:
  if (_size != (xmlParserInputPtr)0x0) {
    (*xmlFree)(_size);
  }
  return cur;
LAB_001719a8:
  if (*(char *)&input->buf == '\0') goto LAB_00171ab8;
  if ((*(char *)&input->buf == '%') ||
     ((*(char *)&input->buf == '&' && (*(char *)((long)&input->buf + 1) != '#')))) {
    bVar1 = *(byte *)&input->buf;
    input = (xmlParserInputPtr)((long)&input->buf + 1);
    pxVar5 = xmlParseStringName((xmlParserCtxtPtr)orig_local,(xmlChar **)&input);
    if ((pxVar5 == (xmlChar *)0x0) || ((*xmlFree)(pxVar5), *(char *)&input->buf != ';')) {
      xmlFatalErrMsgInt((xmlParserCtxtPtr)orig_local,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",(uint)bVar1
                       );
      goto LAB_00171b19;
    }
    if (((bVar1 == 0x25) && (*(int *)(orig_local + 0x2a) == 1)) && (*(int *)(orig_local + 8) == 1))
    {
      xmlFatalErr((xmlParserCtxtPtr)orig_local,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
      goto LAB_00171b19;
    }
    if (*(char *)&input->buf == '\0') goto LAB_00171ab8;
  }
  input = (xmlParserInputPtr)((long)&input->buf + 1);
  goto LAB_001719a8;
LAB_00171ab8:
  *(int *)(orig_local + 0x31) = *(int *)(orig_local + 0x31) + 1;
  cur = xmlStringDecodeEntities((xmlParserCtxtPtr)orig_local,(xmlChar *)_size,2,'\0','\0','\0');
  *(int *)(orig_local + 0x31) = *(int *)(orig_local + 0x31) + -1;
  if (buf != (xmlChar *)0x0) {
    *(xmlParserInputPtr *)buf = _size;
    _size = (xmlParserInputPtr)0x0;
  }
  goto LAB_00171b19;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
                           "entity value too long\n");
            goto error;
        }
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}